

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

VectorXd __thiscall util::argmax(util *this,MatrixXd *m,int axis)

{
  Scalar *pSVar1;
  Index extraout_RDX;
  Index IVar2;
  Index extraout_RDX_00;
  double dVar3;
  VectorXd VVar4;
  ulong local_d8;
  ConstColXpr local_c0;
  ConstRowXpr local_78;
  int local_3c;
  long lStack_38;
  int i;
  Index ind;
  ulong local_28;
  size_t _len;
  bool _rowwise;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDStack_18;
  int axis_local;
  MatrixXd *m_local;
  VectorXd *_indices;
  
  _len._3_1_ = axis == 0;
  _len._4_4_ = axis;
  pDStack_18 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)m;
  m_local = (MatrixXd *)this;
  if ((bool)_len._3_1_) {
    local_d8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                         (&m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  }
  else {
    local_d8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                         (&m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  }
  local_28 = local_d8;
  ind._7_1_ = 0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_28);
  lStack_38 = -1;
  IVar2 = extraout_RDX;
  for (local_3c = 0; (ulong)(long)local_3c < local_28; local_3c = local_3c + 1) {
    if ((_len._3_1_ & 1) == 0) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_c0,pDStack_18,(long)local_3c);
      Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      maxCoeff<long>((DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)&local_c0,&stack0xffffffffffffffc8);
    }
    else {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_78,pDStack_18,(long)local_3c);
      Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::maxCoeff<long>((DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                        *)&local_78,&stack0xffffffffffffffc8);
    }
    dVar3 = (double)lStack_38;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                        (long)local_3c);
    *pSVar1 = dVar3;
    IVar2 = extraout_RDX_00;
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar2;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd argmax(const Eigen::MatrixXd& m, int axis) {
		using namespace Eigen;

		const bool _rowwise = (axis == 0);

		size_t _len = _rowwise ? m.rows() : m.cols();
		VectorXd _indices(_len);

		Index ind = -1;
		for (int i = 0; i < _len; i++) {
			if (_rowwise)
				m.row(i).maxCoeff(&ind);
			else
				m.col(i).maxCoeff(&ind);
			_indices[i] = static_cast<double>(ind);
		}

		return _indices;
	}